

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_rng.c
# Opt level: O0

err_t cmdRngStart(bool_t verbose)

{
  bool_t bVar1;
  err_t eVar2;
  read_i p_Var3;
  size_t count_00;
  size_t sVar4;
  octet *hash_00;
  blob_t seed;
  void *buf;
  int in_EDI;
  char *pcVar5;
  void *state;
  octet *hash;
  tm_ticks_t *data;
  void *stack;
  size_t read;
  size_t count;
  size_t pos;
  char *sources [5];
  err_t code;
  void *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  size_t *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffffb0;
  read_i in_stack_ffffffffffffffb8;
  ulong local_40;
  undefined8 local_38 [5];
  err_t local_c;
  int local_8;
  
  local_8 = in_EDI;
  bVar1 = rngIsValid();
  if (bVar1 != 0) {
    return 0;
  }
  if (local_8 != 0) {
    memcpy(local_38,&PTR_anon_var_dwarf_23a5_001877d0,0x28);
    printf("Starting RNG[");
    in_stack_ffffffffffffffb8 = (read_i)0x0;
    for (local_40 = 0; local_40 < 5; local_40 = local_40 + 1) {
      eVar2 = rngESRead(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                        (size_t)in_stack_ffffffffffffff78,(char *)0x108991);
      p_Var3 = in_stack_ffffffffffffffb8;
      if (eVar2 == 0) {
        p_Var3 = in_stack_ffffffffffffffb8 + 1;
        pcVar5 = "%s";
        if (in_stack_ffffffffffffffb8 != (read_i)0x0) {
          pcVar5 = ", %s";
        }
        printf(pcVar5,local_38[local_40]);
      }
      in_stack_ffffffffffffffb8 = p_Var3;
    }
    printf("]... ");
  }
  local_c = rngESHealth();
  if (local_c == 0) {
    local_c = rngCreate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  else if (local_c == 0x12f) {
    count_00 = beltHash_keep();
    sVar4 = prngEcho_keep();
    if (sVar4 < count_00) {
      hash_00 = (octet *)beltHash_keep();
    }
    else {
      hash_00 = (octet *)prngEcho_keep();
    }
    seed = blobCreate((size_t)in_stack_ffffffffffffff78);
    local_c = 0x6e;
    if (seed != (blob_t)0x0) {
      local_c = 0;
    }
    if (local_c != 0) {
      return local_c;
    }
    buf = (void *)((long)seed + 0x400);
    local_c = cmdRngKbRead((tm_ticks_t *)in_stack_ffffffffffffffb8);
    if (local_c != 0) {
      blobClose((blob_t)0x108ae2);
      return local_c;
    }
    beltHashStart(hash_00);
    beltHashStepH(buf,count_00,hash_00);
    beltHashStepG(hash_00,in_stack_ffffffffffffff78);
    prngEchoStart(buf,seed,0x20);
    local_c = rngCreate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    blobClose((blob_t)0x108b52);
  }
  if (local_8 != 0) {
    pcVar5 = errMsg(local_c);
    printf("%s\n",pcVar5);
  }
  return local_c;
}

Assistant:

err_t cmdRngStart(bool_t verbose)
{
	err_t code;
	// ГСЧ уже запущен?
	if (rngIsValid())
		return ERR_OK;
	// печать информации об источниках
	if (verbose)
	{
		const char* sources[] = { "trng", "trng2", "sys", "sys2", "timer" };
		size_t pos;
		size_t count;
		size_t read;
		printf("Starting RNG[");
		for (pos = count = 0; pos < COUNT_OF(sources); ++pos)
			if (rngESRead(&read, 0, 0, sources[pos]) == ERR_OK)
				printf(count++ ? ", %s" : "%s", sources[pos]);
		printf("]... ");
	}
	// энтропии достаточно?
	code = rngESHealth();
	if (code == ERR_OK)
		code = rngCreate(0, 0);
	// нет, подключить клавиатурный источник
	else if (code == ERR_NOT_ENOUGH_ENTROPY)
	{
		void* stack;
		tm_ticks_t* data;
		octet* hash;
		void* state;
		// выделить и разметить память
		code = cmdBlobCreate(stack, 128 * sizeof(tm_ticks_t) +
			MAX2(beltHash_keep(), prngEcho_keep()));
		ERR_CALL_CHECK(code);
		data = (tm_ticks_t*)stack;
		hash = (octet*)data;
		state = data + 128;
		// собрать данные от клавиатурного источника
		code = cmdRngKbRead(data);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// хэшировать
		beltHashStart(state);
		beltHashStepH(data, 128 * sizeof(tm_ticks_t), state);
		beltHashStepG(hash, state);
		// запустить echo-генератор
		prngEchoStart(state, hash, 32);
		// запустить генератор
		code = rngCreate(prngEchoRead, state);
		// освободить память
		cmdBlobClose(stack);
	}
	if (verbose)
		printf("%s\n", errMsg(code));
	return code;
}